

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

void ImportModuleNamespaces(ParseContext *ctx,Lexeme *pos,ByteCode *bCode)

{
  SmallArray<SynNamespaceElement_*,_32U> *this;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ExternNamespaceInfo *pEVar4;
  undefined4 extraout_var;
  size_t sVar5;
  undefined4 extraout_var_00;
  ulong uVar6;
  char *__s;
  ulong uVar7;
  ulong uVar8;
  Lexeme *begin;
  SynNamespaceElement *parent;
  TraceScope traceScope;
  TraceScope local_40;
  SynIdentifier *name;
  
  if ((ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token),
     iVar2 != 0)) {
    ImportModuleNamespaces::token = NULLC::TraceGetToken("parser","ImportModuleNamespaces");
    __cxa_guard_release(&ImportModuleNamespaces(ParseContext&,Lexeme*,ByteCode*)::token);
  }
  NULLC::TraceScope::TraceScope(&local_40,ImportModuleNamespaces::token);
  pcVar3 = FindSymbols(bCode);
  pEVar4 = FindFirstNamespace(bCode);
  if (bCode->namespaceCount != 0) {
    this = &ctx->namespaceList;
    uVar8 = 0;
    do {
      __s = pcVar3 + pEVar4[uVar8].offsetToName;
      if (pEVar4[uVar8].parentHash == 0xffffffff) {
        parent = (SynNamespaceElement *)0x0;
      }
      else {
        uVar6 = (ulong)(ctx->namespaceList).count;
        if (uVar6 == 0) {
LAB_00118ce6:
          anon_unknown.dwarf_15b62::Stop(ctx,pos,"ERROR: namespace %s parent not found",__s);
        }
        uVar7 = 0;
        while (parent = this->data[uVar7], parent->fullNameHash != pEVar4[uVar8].parentHash) {
          uVar7 = uVar7 + 1;
          if (uVar6 == uVar7) goto LAB_00118ce6;
        }
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      name = (SynIdentifier *)CONCAT44(extraout_var,iVar2);
      if (ctx->currentLexeme <= ctx->firstLexeme) {
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      begin = ctx->currentLexeme + -1;
      sVar5 = strlen(__s);
      SynBase::SynBase((SynBase *)name,4,begin,begin);
      (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
      (name->name).begin = __s;
      (name->name).end = __s + sVar5;
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      SynNamespaceElement::SynNamespaceElement
                ((SynNamespaceElement *)CONCAT44(extraout_var_00,iVar2),parent,name);
      uVar1 = (ctx->namespaceList).count;
      if (uVar1 == (ctx->namespaceList).max) {
        SmallArray<SynNamespaceElement_*,_32U>::grow(this,uVar1);
      }
      if (this->data == (SynNamespaceElement **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<SynNamespaceElement *, 32>::push_back(const T &) [T = SynNamespaceElement *, N = 32]"
                     );
      }
      uVar1 = (ctx->namespaceList).count;
      (ctx->namespaceList).count = uVar1 + 1;
      this->data[uVar1] = (SynNamespaceElement *)CONCAT44(extraout_var_00,iVar2);
      uVar8 = uVar8 + 1;
    } while (uVar8 < bCode->namespaceCount);
  }
  NULLC::TraceScope::~TraceScope(&local_40);
  return;
}

Assistant:

void ImportModuleNamespaces(ParseContext &ctx, Lexeme *pos, ByteCode *bCode)
{
	TRACE_SCOPE("parser", "ImportModuleNamespaces");

	char *symbols = FindSymbols(bCode);

	// Import namespaces
	ExternNamespaceInfo *namespaceList = FindFirstNamespace(bCode);

	for(unsigned i = 0; i < bCode->namespaceCount; i++)
	{
		ExternNamespaceInfo &ns = namespaceList[i];

		const char *name = symbols + ns.offsetToName;

		SynNamespaceElement *parent = NULL;

		if(ns.parentHash != ~0u)
		{
			for(unsigned k = 0; k < ctx.namespaceList.size(); k++)
			{
				if(ctx.namespaceList[k]->fullNameHash == ns.parentHash)
				{
					parent = ctx.namespaceList[k];
					break;
				}
			}

			if(!parent)
				Stop(ctx, pos, "ERROR: namespace %s parent not found", name);
		}

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), InplaceStr(name));

		ctx.namespaceList.push_back(new (ctx.get<SynNamespaceElement>()) SynNamespaceElement(parent, nameIdentifier));
	}
}